

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2;
  ParenthesizedExpressionSyntax *args_5;
  ActionBlockSyntax *args_6;
  ImmediateAssertionStatementSyntax *pIVar1;
  DeepCloneVisitor visitor_2;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  NamedLabelSyntax *local_30;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_30 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_30 = (NamedLabelSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x18),&visitor,(BumpAllocator *)__child_stack);
  }
  args_2 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x20),
                      (BumpAllocator *)__child_stack);
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x68) == (SyntaxNode *)0x0) {
    _visitor_1 = (SyntaxNode *)0x0;
  }
  else {
    _visitor_1 = detail::
                 visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                           (*(SyntaxNode **)(__fn + 0x68),&visitor_1,(BumpAllocator *)__child_stack)
    ;
  }
  args_5 = (ParenthesizedExpressionSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x70),&visitor_2,(BumpAllocator *)__child_stack);
  args_6 = (ActionBlockSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x78),&visitor_2,(BumpAllocator *)__child_stack);
  pIVar1 = BumpAllocator::
           emplace<slang::syntax::ImmediateAssertionStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DeferredAssertionSyntax*,slang::syntax::ParenthesizedExpressionSyntax&,slang::syntax::ActionBlockSyntax&>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,&local_30,args_2,
                      (Token *)&visitor,(DeferredAssertionSyntax **)&visitor_1,args_5,args_6);
  return (int)pIVar1;
}

Assistant:

static SyntaxNode* clone(const ImmediateAssertionStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ImmediateAssertionStatementSyntax>(
        node.kind,
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.delay ? deepClone(*node.delay, alloc) : nullptr,
        *deepClone<ParenthesizedExpressionSyntax>(*node.expr, alloc),
        *deepClone<ActionBlockSyntax>(*node.action, alloc)
    );
}